

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

STRING_HANDLE STRING_new_with_memory(char *memory)

{
  STRING_HANDLE pSVar1;
  LOGGER_LOG p_Var2;
  
  if (memory != (char *)0x0) {
    pSVar1 = (STRING_HANDLE)malloc(8);
    if (pSVar1 != (STRING_HANDLE)0x0) {
      pSVar1->s = memory;
      return pSVar1;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                ,"STRING_new_with_memory",0xd9,1,"Failure: allocating memory string");
      return (STRING_HANDLE)0x0;
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_new_with_memory(const char* memory)
{
    STRING* result;
    if (memory == NULL)
    {
        /* Codes_SRS_STRING_07_007: [STRING_new_with_memory shall return a NULL STRING_HANDLE if the supplied char* is NULL.] */
        result = NULL;
    }
    else
    {
        if ((result = (STRING*)malloc(sizeof(STRING))) != NULL)
        {
            result->s = (char*)memory;
        }
        else
        {
            LogError("Failure: allocating memory string");
        }
    }
    return (STRING_HANDLE)result;
}